

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O2

void __thiscall duckdb::HTMLTreeRenderer::Render(HTMLTreeRenderer *this,Pipeline *op,ostream *ss)

{
  type root;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> tree;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_> local_20;
  
  RenderTree::CreateRenderTree((RenderTree *)&local_20,op);
  root = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                   ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *
                    )&local_20);
  TreeRenderer::ToStream(&this->super_TreeRenderer,root,ss);
  ::std::unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void HTMLTreeRenderer::Render(const Pipeline &op, std::ostream &ss) {
	auto tree = RenderTree::CreateRenderTree(op);
	ToStream(*tree, ss);
}